

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O2

void cppjieba::GetStringsFromWords
               (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *strs)

{
  size_t i;
  ulong uVar1;
  long lVar2;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(strs,((long)(words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x30);
  lVar2 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)(((long)(words->
                             super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(words->
                            super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                            _M_impl.super__Vector_impl_data._M_start) / 0x30); uVar1 = uVar1 + 1) {
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&(((strs->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2));
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

inline void GetStringsFromWords(const vector<Word>& words, vector<string>& strs) {
  strs.resize(words.size());
  for (size_t i = 0; i < words.size(); ++i) {
    strs[i] = words[i].word;
  }
}